

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double fisk_cdf_inv(double cdf,double a,double b,double c)

{
  double dVar1;
  double local_38;
  double x;
  double r8_huge;
  double c_local;
  double b_local;
  double a_local;
  double cdf_local;
  
  local_38 = 0.0;
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = a;
    if (0.0 < cdf) {
      if (1.0 <= cdf) {
        dVar1 = local_38;
        if (1.0 <= cdf) {
          local_38 = 1e+30;
          dVar1 = local_38;
        }
      }
      else {
        dVar1 = pow(cdf / (1.0 - cdf),1.0 / c);
        dVar1 = b * dVar1 + a;
      }
    }
    local_38 = dVar1;
    return local_38;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"FISK_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double fisk_cdf_inv ( double cdf, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    FISK_CDF_INV inverts the Fisk CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Output, double FISK_CDF_INV, the corresponding argument of the CDF.
//
{
  const double r8_huge = 1.0E+30;
  double x = 0.0;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "FISK_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf <= 0.0 )
  {
    x = a;
  }
  else if ( cdf < 1.0 )
  {
    x = a + b * pow ( cdf / ( 1.0 - cdf ), 1.0 / c );
  }
  else if ( 1.0 <= cdf )
  {
    x = r8_huge;
  }

  return x;
}